

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool substituteImports(value *v)

{
  int iVar1;
  pointer pbVar2;
  bool bVar3;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,picojson::value>,std::_Select1st<std::pair<std::__cxx11::string_const,picojson::value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>
  *this;
  iterator __position;
  undefined7 uVar9;
  string *psVar4;
  ostream *poVar5;
  _Rb_tree_node_base *p_Var6;
  object *poVar7;
  _Base_ptr p_Var8;
  pointer pbVar10;
  undefined1 local_2d0 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
  impit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> i;
  undefined1 local_78 [8];
  string importFile;
  undefined1 local_48 [8];
  value importValue;
  
  if (v->type_ == 5) {
    this = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,picojson::value>,std::_Select1st<std::pair<std::__cxx11::string_const,picojson::value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>
            *)picojson::value::
              get<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                        (v);
    std::__cxx11::string::string((string *)local_2d0,"import",(allocator *)&stack0xffffffffffffff58)
    ;
    __position = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                         *)this,(key_type *)local_2d0);
    std::__cxx11::string::~string((string *)local_2d0);
    uVar9 = (undefined7)((ulong)(this + 8) >> 8);
    if (__position._M_node == (_Base_ptr)(this + 8)) {
      importValue.u_._4_4_ = (undefined4)CONCAT71(uVar9,1);
      for (p_Var6 = *(_Rb_tree_node_base **)(this + 0x18); p_Var6 != __position._M_node;
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
        ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                *)local_2d0,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                *)(p_Var6 + 1));
        bVar3 = substituteImports((value *)((long)&impit.first.field_2 + 8));
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                 *)local_2d0);
        if (!bVar3) goto LAB_00115bf6;
      }
    }
    else {
      importValue.u_._4_4_ = (undefined4)CONCAT71(uVar9,1);
      psVar4 = picojson::value::get<std::__cxx11::string>((value *)(__position._M_node + 2));
      std::__cxx11::string::string((string *)local_78,(string *)psVar4);
      importFile.field_2._8_8_ = this;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,picojson::value>,std::_Select1st<std::pair<std::__cxx11::string_const,picojson::value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>
      ::erase_abi_cxx11_(this,__position);
      pbVar2 = options.includeDirs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_48._0_4_ = 0;
      for (pbVar10 = options.includeDirs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar2;
          pbVar10 = pbVar10 + 1) {
        std::__cxx11::string::string((string *)&stack0xffffffffffffff58,(string *)pbVar10);
        local_2d0._0_4_ = 0;
        picojson::value::operator=((value *)local_48,(value *)local_2d0);
        picojson::value::~value((value *)local_2d0);
        std::operator+(&local_c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffffff58,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                      );
        std::ifstream::ifstream((value *)local_2d0,local_c8._M_dataplus._M_p,_S_in);
        iVar1 = *(int *)((long)&impit.first.field_2 +
                        *(long *)(CONCAT44(local_2d0._4_4_,local_2d0._0_4_) + -0x18) + 8);
        std::ifstream::close();
        std::ifstream::~ifstream((value *)local_2d0);
        if (iVar1 == 0) {
          bVar3 = loadFile(&local_c8,(value *)local_48);
          if (bVar3) {
            std::__cxx11::string::~string((string *)&local_c8);
            std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
            if (local_48._0_4_ == 5) {
              poVar7 = picojson::value::
                       get<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                                 ((value *)local_48);
              for (p_Var8 = (poVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var8 != &(poVar7->_M_t)._M_impl.super__Rb_tree_header;
                  p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                        *)local_2d0,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                        *)(p_Var8 + 1));
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                ::pair<picojson::value_&,_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                            *)&stack0xffffffffffffff58,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2d0,(value *)((long)&impit.first.field_2 + 8));
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,picojson::value>,std::_Select1st<std::pair<std::__cxx11::string_const,picojson::value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,picojson::value>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,picojson::value>,std::_Select1st<std::pair<std::__cxx11::string_const,picojson::value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>
                            *)importFile.field_2._8_8_,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                            *)&stack0xffffffffffffff58);
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                         *)&stack0xffffffffffffff58);
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                         *)local_2d0);
              }
            }
            goto LAB_00115bde;
          }
        }
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
      }
      poVar5 = std::operator<<((ostream *)&std::cerr,"error: failed \'import\' substitution of \'");
      poVar5 = std::operator<<(poVar5,(string *)local_78);
      poVar5 = std::operator<<(poVar5,"\'");
      std::endl<char,std::char_traits<char>>(poVar5);
LAB_00115bde:
      picojson::value::~value((value *)local_48);
      std::__cxx11::string::~string((string *)local_78);
      if (pbVar10 == pbVar2) {
LAB_00115bf6:
        importValue.u_._4_4_ = 0;
      }
    }
  }
  else {
    importValue.u_._4_4_ = 1;
  }
  return SUB41(importValue.u_._4_4_,0);
}

Assistant:

static bool substituteImports(value *v)
{
    if (v->is<object>()) {
        object &o = v->get<object>();

        auto it = o.find("import");
        if (it != o.end()) {
            std::string importFile = it->second.get<std::string>();
            o.erase(it);

            value importValue;
            if (!loadFileInIncludeDirs(importFile, &importValue)) {
                cerr << "error: failed 'import' substitution of '" << importFile << "'" << endl;
                return false;
            }
            if (importValue.is<object>()) {
                for (auto impit : importValue.get<object>())
                    o.insert(pair<string,value>(impit.first, impit.second));
            }
        } else {
            for (auto i : o) {
                bool ok = substituteImports(&i.second);
                if (!ok)
                    return false;
            }
        }
    }
    return true;
}